

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_merge_mirrored(Integer g_a)

{
  undefined1 auVar1 [16];
  logical lVar2;
  Integer IVar3;
  void *x;
  long in_RDI;
  void *ptr_a;
  int chk;
  long bigint;
  int local_sync_end;
  int local_sync_begin;
  Integer total;
  Integer bytes;
  char *nptr;
  char *bptr;
  char *zptr;
  Integer atype;
  Integer type;
  Integer count;
  Integer nelem;
  Integer ld [7];
  Integer hi [7];
  Integer lo [7];
  Integer *in_stack_00000128;
  Integer ndim;
  Integer itmp;
  Integer index [7];
  Integer j;
  Integer i;
  C_Integer *width;
  C_Integer *dims;
  C_Integer *map;
  int *blocks;
  Integer nblocks;
  Integer zproc;
  Integer zero;
  Integer nnodes;
  Integer nprocs;
  Integer inode;
  Integer handle;
  Integer *in_stack_00000200;
  void *in_stack_00000208;
  Integer *in_stack_00000210;
  Integer *in_stack_00000218;
  Integer in_stack_00000220;
  Integer in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  int iVar4;
  int iVar5;
  int iVar6;
  Integer in_stack_fffffffffffffe40;
  long local_138 [8];
  long local_f8 [8];
  long local_b8;
  long local_68;
  C_Integer *local_60;
  C_Integer *local_58;
  C_Integer *local_50;
  int *local_48;
  long local_38;
  undefined8 local_30;
  Integer local_28;
  Integer local_20;
  Integer local_18;
  long local_10;
  long local_8;
  
  iVar5 = _ga_sync_end;
  iVar6 = _ga_sync_begin;
  local_10 = in_RDI + 1000;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_8 = in_RDI;
  if (iVar6 != 0) {
    pnga_sync();
  }
  lVar2 = pnga_is_mirrored(local_8);
  if (lVar2 != 0) {
    local_18 = pnga_cluster_nodeid();
    local_28 = pnga_cluster_nnodes();
    local_20 = pnga_cluster_nprocs(0x1da976);
    local_30 = 0;
    local_38 = pnga_cluster_procid((Integer)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_50 = GA[local_10].mapc;
    local_48 = GA[local_10].nblock;
    local_58 = GA[local_10].dims;
    local_60 = GA[local_10].width;
    local_b8 = (long)GA[local_10].ndim;
    IVar3 = GAsizeof((long)GA[local_10].type);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x7fffffff),8);
    x = SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffff)) / SEXT816(IVar3),0);
    local_18 = GAme - local_38;
    pnga_distribution(index[0],itmp,(Integer *)ndim,in_stack_00000128);
    iVar4 = 1;
    for (local_68 = 0; local_68 < local_b8; local_68 = local_68 + 1) {
      if (local_138[local_68] < local_f8[local_68]) {
        iVar4 = 0;
      }
    }
    if (iVar4 != 0) {
      pnga_access_ptr(in_stack_00000220,in_stack_00000218,in_stack_00000210,in_stack_00000208,
                      in_stack_00000200);
      pnga_pgroup_gop(in_stack_fffffffffffffe40,CONCAT44(iVar6,iVar5),x,
                      CONCAT44(iVar4,in_stack_fffffffffffffe28),in_stack_fffffffffffffe20);
    }
    if (iVar5 != 0) {
      pnga_sync();
    }
  }
  return;
}

Assistant:

void pnga_merge_mirrored(Integer g_a)
{
  Integer handle = GA_OFFSET + g_a;
  Integer inode, nprocs, nnodes, zero, zproc, nblocks;
  int *blocks;
  C_Integer  *map, *dims, *width;
  Integer i, j, index[MAXDIM], itmp, ndim;
  Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM];
  Integer nelem, count, type, atype=ARMCI_INT;
  char *zptr=NULL, *bptr=NULL, *nptr=NULL;
  Integer bytes, total;
  int local_sync_begin, local_sync_end;
  long bigint;
  int chk = 1;
  void *ptr_a;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end = 1; /*remove any previous masking */
  if (local_sync_begin) pnga_sync();
  /* don't perform update if node is not mirrored */
  if (!pnga_is_mirrored(g_a)) return;

  inode = pnga_cluster_nodeid();
  nnodes = pnga_cluster_nnodes(); 
  nprocs = pnga_cluster_nprocs(inode);
  zero = 0;

  zproc = pnga_cluster_procid(inode, zero);
  zptr = GA[handle].ptr[zproc];
  map = GA[handle].mapc;
  blocks = GA[handle].nblock;
  dims = GA[handle].dims;
  width = GA[handle].width;
  type = GA[handle].type;
  ndim = GA[handle].ndim;
  bigint = 2147483647L/GAsizeof(type);

#ifdef OPENIB
  /* Check whether or not all nodes contain the same number
     of processors. */
  if (nnodes*nprocs == pnga_nnodes())  {
    /* check to see if there is any buffer space between the data
       associated with each processor that needs to be zeroed out
       before performing the merge */
    if (zproc == GAme) {
      /* the use of nblocks instead of nprocs is designed to support a peculiar
         coding style in which the dimensions of the block array are all set to
         1 and all the data is restricted to the master processor on the node */
      nblocks = 1;
      for (i=0; i<ndim; i++) {
        nblocks *= blocks[i];
      }
      for (i=0; i<nblocks; i++) {
        /* Find out from mapc data how many elements are supposed to be located
           on this processor. Start by converting processor number to indices */
        itmp = i;
        for (j=0; j<ndim; j++) {
          index[j] = itmp%(Integer)blocks[j];
          itmp = (itmp - index[j])/(Integer)blocks[j];
        }

        nelem = 1;
        count = 0;
        for (j=0; j<ndim; j++) {
          if (index[j] < (Integer)blocks[j]-1) {
            nelem *= (Integer)(map[index[j]+1+count] - map[index[j]+count]
                   + 2*width[j]);
          } else {
            nelem *= (Integer)(dims[j] - map[index[j]+count] + 1 + 2*width[j]);
          }
          count += (Integer)blocks[j];
        }
        /* We now have the total number of elements located on this processor.
           Find out if the location of the end of this data set matches the
           origin of the data on the next processor. If not, then zero data in
           the gap. */
        nelem *= GAsizeof(type);
        bptr = GA[handle].ptr[pnga_cluster_procid(inode, i)];
        bptr += nelem;
        if (i<nblocks-1) {
          j = i+1;
          nptr = GA[handle].ptr[pnga_cluster_procid(inode, j)];
          if (bptr != nptr) {
            bytes = (long)nptr - (long)bptr;
            /* BJP printf("p[%d] Gap on proc %d is %d\n",GAme,i,bytes); */
            bzero(bptr, bytes);
          }
        }
      }
      /* find total number of bytes containing global array */
      total = (long)bptr - (long)zptr;
      total /= GAsizeof(type);
      /*convert from C data type to ARMCI type */
      switch(type) {
        case C_FLOAT: atype=ARMCI_FLOAT; break;
        case C_DBL: atype=ARMCI_DOUBLE; break;
        case C_LONG: atype=ARMCI_LONG; break;
        case C_INT: atype=ARMCI_INT; break;
        case C_DCPL: atype=ARMCI_DOUBLE; break;
        case C_SCPL: atype=ARMCI_FLOAT; break;
        default: pnga_error("type not supported",type);
      }
      /* now that gap data has been zeroed, do a global sum on data */
      {
        int i, len;
        int nsteps = (int) ceil(((double)total)/((double)bigint));
        long istart=0;
        /* printf("%ld total %ld bigint %ld  nsteps %d \n",GAme,total,bigint,nsteps); */
        for (i=0; i < nsteps; i++){

          len=bigint;
          if (istart+len > total) len=((long)(total - istart));
          /* printf("%ld step %d of %d  len= %d total=%ld istart= %ld\n",GAme,(i+1),nsteps,len,total,istart); */
          armci_msg_gop_scope(SCOPE_MASTERS, zptr+istart*GAsizeof(type), len, "+", atype);
          istart+=len;
        }
      }
    } 
  } else {
    Integer _ga_tmp;
    Integer idims[MAXDIM], iwidth[MAXDIM], ichunk[MAXDIM];
    void *one = NULL;
    double d_one = 1.0;
    int i_one = 1;
    float f_one = 1.0;
    long l_one = 1;
    double c_one[2];
    float cf_one[2];
    c_one[0] = 1.0;
    c_one[1] = 0.0;

    cf_one[0] = 1.0;
    cf_one[1] = 0.0;

    /* choose one as scaling factor in accumulate */
    switch (type) {
      case C_FLOAT: one = &f_one; break;
      case C_DBL: one = &d_one; break;
      case C_LONG: one = &l_one; break;
      case C_INT: one = &i_one; break;
      case C_DCPL: one = &c_one; break;
      case C_SCPL: one = &cf_one; break;
      default: pnga_error("type not supported",type);
    }
    
  /* Nodes contain a mixed number of processors. Create a temporary GA to
     complete merge operation. */
    count = 0;
    for (i=0; i<ndim; i++) {
      idims[i] = (Integer)dims[i];
      iwidth[i] = (Integer)width[i];
      ichunk[i] = 0;
    }
    if (!pnga_create_ghosts(type, ndim, idims,
        iwidth, "temporary", ichunk, &_ga_tmp)) 
      pnga_error("Unable to create work array for merge",GAme);
    pnga_zero(_ga_tmp);
    /* Find data on this processor and accumulate in temporary global array */
    inode = GAme - zproc;
    pnga_distribution(g_a,inode,lo,hi);

    /* Check to make sure processor has data */
    chk = 1;
    for (i=0; i<ndim; i++) {
      if (hi[i]<lo[i]) {
        chk = 0;
      }
    }
    if (chk) {
      pnga_access_ptr(g_a, lo, hi, &ptr_a, ld);
      pnga_acc(_ga_tmp, lo, hi, ptr_a, ld, one);
    }
    /* copy data back to original global array */
    pnga_sync();
    if (chk) {
      pnga_get(_ga_tmp, lo, hi, ptr_a, ld);
    }
    pnga_destroy(_ga_tmp);
  }
#else
  inode = GAme - zproc;
  pnga_distribution(g_a,inode,lo,hi);
  /* Check to make sure processor has data */
  chk = 1;
  nelem = 1;
  for (i=0; i<ndim; i++) {
    nelem *= (hi[i]-lo[i]+1);
    if (hi[i]<lo[i]) {
      chk = 0;
    }
  }
  if (chk) {
    pnga_access_ptr(g_a, lo, hi, &ptr_a, ld);
    pnga_pgroup_gop(_mirror_gop_grp,type,ptr_a,nelem,"+");
  }
#endif
  if (local_sync_end) pnga_sync();
}